

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Program.h
# Opt level: O2

Expr * __thiscall Program::makeExpr<StackAlloc,Value*&>(Program *this,Value **args)

{
  Expr *pEVar1;
  _Head_base<0UL,_Expr_*,_false> local_20;
  _Head_base<0UL,_Expr_*,_false> local_18;
  
  std::make_unique<StackAlloc,Value*&>((Value **)&local_18);
  local_20._M_head_impl = local_18._M_head_impl;
  local_18._M_head_impl = (Expr *)0x0;
  pEVar1 = addOwnership(this,(unique_ptr<Expr,_std::default_delete<Expr>_> *)&local_20);
  if (local_20._M_head_impl != (Expr *)0x0) {
    (*(local_20._M_head_impl)->_vptr_Expr[1])();
  }
  local_20._M_head_impl = (Expr *)0x0;
  if (local_18._M_head_impl != (Expr *)0x0) {
    (*(local_18._M_head_impl)->_vptr_Expr[1])();
  }
  return pEVar1;
}

Assistant:

Expr* makeExpr(Args&&... args) {
        return addOwnership(std::make_unique<T>(std::forward<Args>(args)...));
    }